

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O3

string * __thiscall
cfd::api::TransactionApi::CreateSignatureHash
          (string *__return_storage_ptr__,TransactionApi *this,string *tx_hex,Txid *txid,
          uint32_t vout,ByteData *key_data,Amount *amount,HashType hash_type,
          SigHashType *sighash_type)

{
  HashType HVar1;
  SigHashType *sighash_type_00;
  pointer puVar2;
  CfdException *this_00;
  WitnessVersion version;
  Pubkey local_128;
  ByteData local_108;
  undefined1 local_e8 [56];
  ByteData local_b0;
  SigHashType local_98;
  SigHashType local_8c;
  TransactionController txc;
  
  HVar1 = hash_type;
  core::ByteData::ByteData(&local_108);
  TransactionController::TransactionController(&txc,tx_hex);
  sighash_type_00 = sighash_type;
  if (HVar1 < 4) {
    version = -(uint)((HVar1 & ~kP2sh) != kP2wpkh);
    switch(HVar1) {
    default:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0,&key_data->data_
                );
      core::Pubkey::Pubkey(&local_128,&local_b0);
      core::SigHashType::SigHashType(&local_8c,sighash_type_00);
      TransactionController::CreateSignatureHash
                ((ByteData *)local_e8,&txc,txid,vout,&local_128,&local_8c,amount,version);
      puVar2 = local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_e8._0_8_;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._16_8_;
      local_e8._0_8_ = (_func_int **)0x0;
      local_e8._8_8_ = (pointer)0x0;
      local_e8._16_8_ = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
        if ((_func_int **)local_e8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_e8._0_8_);
        }
      }
      if ((_func_int **)
          local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (_func_int **)0x0) {
        operator_delete(local_128.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      break;
    case kP2sh:
    case kP2wsh:
      core::Script::Script((Script *)local_e8,key_data);
      core::SigHashType::SigHashType(&local_98,sighash_type_00);
      TransactionController::CreateSignatureHash
                (&local_128.data_,&txc,txid,vout,(Script *)local_e8,&local_98,amount,version);
      puVar2 = local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2);
        if ((_func_int **)
            local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (_func_int **)0x0) {
          operator_delete(local_128.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      core::Script::~Script((Script *)local_e8);
    }
    core::ByteData::GetHex_abi_cxx11_(__return_storage_ptr__,&local_108);
    txc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&PTR__TransactionController_00724b20;
    core::Transaction::~Transaction(&txc.transaction_);
    if ((_func_int **)
        local_108.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_108.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_e8._0_8_ = "cfdapi_transaction.cpp";
  local_e8._8_4_ = 0xb3;
  local_e8._16_8_ = "CreateSignatureHash";
  core::logger::log<cfd::core::HashType&>
            ((CfdSourceLocation *)local_e8,kCfdLogLevelWarning,
             "Failed to CreateSignatureHash. Invalid hash_type: hash_type={}",&hash_type);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8._0_8_ = local_e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,
             "Invalid hash_type. hash_type must be \"p2pkh\"(0) or \"p2sh\"(1) or \"p2wpkh\"(2) or \"p2wsh\"(3)."
             ,"");
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_e8);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string TransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const ByteData& key_data, const Amount& amount, HashType hash_type,
    const SigHashType& sighash_type) const {
  ByteData sig_hash;
  TransactionController txc(tx_hex);
  WitnessVersion version = WitnessVersion::kVersionNone;
  if ((hash_type == HashType::kP2wpkh) || (hash_type == HashType::kP2wsh)) {
    version = WitnessVersion::kVersion0;
  }

  switch (hash_type) {
    case HashType::kP2pkh:
      // fall-through
    case HashType::kP2wpkh:
      sig_hash = txc.CreateSignatureHash(
          txid, vout, Pubkey(key_data), sighash_type, amount, version);
      break;
    case HashType::kP2sh:
      // fall-through
    case HashType::kP2wsh:
      sig_hash = txc.CreateSignatureHash(
          txid, vout, Script(key_data), sighash_type, amount, version);
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateSignatureHash. Invalid hash_type: "
          "hash_type={}",  // NOLINT
          hash_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid hash_type. hash_type must be \"p2pkh\"(0) "
          "or \"p2sh\"(1) or \"p2wpkh\"(2) or \"p2wsh\"(3).");  // NOLINT
  }

  return sig_hash.GetHex();
}